

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::scan
               (FinalOptimizer *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  _func_void_FinalOptimizer_ptr_Expression_ptr_ptr_conflict1 *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_00a90db8:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_00a909d3:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00a90db8;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>).
                     super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00a90925;
  case LoopId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00a90db8;
    }
    goto LAB_00a902f6;
  case BreakId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00a90db8;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>).
                     super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00a9015a;
  case SwitchId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x00a90154;
  case CallId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00a90db8;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitCallIndirect,
               currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00a90db8;
    }
    break;
  case LocalSetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00a90db8;
    }
    goto LAB_00a905f1;
  case GlobalGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitGlobalGet,currp)
    ;
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00a90db8;
    }
    break;
  case GlobalSetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitGlobalSet,currp)
    ;
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00a90db8;
    }
    goto LAB_00a902f6;
  case LoadId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_00a90db8;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_00a90829;
  case StoreId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00a90db8;
    }
    goto LAB_00a905ba;
  case ConstId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00a90db8;
    }
    break;
  case UnaryId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00a90db8;
    }
    goto LAB_00a905f1;
  case BinaryId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90551;
  case SelectId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90805;
  case DropId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case ReturnId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00a90db8;
    }
    goto LAB_00a9014b;
  case MemorySizeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemorySize,currp
              );
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00a90db8;
    }
    break;
  case MemoryGrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemoryGrow,currp
              );
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case NopId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00a90db8;
    }
    break;
  case UnreachableId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitUnreachable,
               currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00a90db8;
    }
    break;
  case AtomicRMWId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicRMW,currp)
    ;
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90636;
  case AtomicCmpxchgId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicCmpxchg,
               currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90627;
  case AtomicWaitId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicWait,currp
              );
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90317;
  case AtomicNotifyId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicNotify,
               currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90551;
  case AtomicFenceId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicFence,
               currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00a90db8;
    }
    break;
  case SIMDExtractId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDExtract,
               currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00a90db8;
    }
    goto LAB_00a905f1;
  case SIMDReplaceId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDReplace,
               currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00a90db8;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_00a9055c;
  case SIMDShuffleId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDShuffle,
               currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90814;
  case SIMDTernaryId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDTernary,
               currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90317;
  case SIMDShiftId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDShift,currp)
    ;
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90551;
  case SIMDLoadId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00a90db8;
    }
    goto LAB_00a904d6;
  case SIMDLoadStoreLaneId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00a90db8;
    }
LAB_00a905ba:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00a90829;
  case MemoryInitId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemoryInit,currp
              );
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90627;
  case DataDropId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00a90db8;
    }
    break;
  case MemoryCopyId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemoryCopy,currp
              );
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90805;
  case MemoryFillId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemoryFill,currp
              );
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90805;
  case PopId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00a90db8;
    }
    break;
  case RefNullId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00a90db8;
    }
    break;
  case RefIsNullId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefIsNull,currp)
    ;
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case RefFuncId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00a90db8;
    }
    break;
  case RefEqId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90814;
  case TableGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00a90db8;
    }
    goto LAB_00a902f6;
  case TableSetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90636;
  case TableSizeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableSize,currp)
    ;
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00a90db8;
    }
    break;
  case TableGrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableGrow,currp)
    ;
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90636;
  case TableFillId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableFill,currp)
    ;
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90627;
  case TableCopyId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableCopy,currp)
    ;
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90805;
  case TableInitId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableInit,currp)
    ;
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90627;
  case TryId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00a90db8;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_00a902f6:
    pEVar1 = pEVar1 + 2;
    goto LAB_00a90829;
  case TryTableId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTryTable,currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case ThrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00a90db8;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00a90db8;
    }
    break;
  case ThrowRefId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitThrowRef,currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case TupleMakeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTupleMake,currp)
    ;
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00a90db8;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTupleExtract,
               currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case RefI31Id:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefI31,currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case I31GetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case CallRefId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case RefCastId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case BrOnId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00a90db8;
    }
LAB_00a904d6:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00a90829;
  case StructNewId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructNew,currp)
    ;
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00a90db8;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructGet,currp)
    ;
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00a90db8;
    }
    goto LAB_00a905f1;
  case StructSetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructSet,currp)
    ;
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90551;
  case StructRMWId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructRMW,currp)
    ;
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90551;
  case StructCmpxchgId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructCmpxchg,
               currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_00a90db8;
    }
LAB_00a90317:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_00a9055c;
  case ArrayNewId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
LAB_00a9014b:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x00a90154:
    if (lVar4 != 0) {
LAB_00a9015a:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>).
                     super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayNewData,
               currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90636;
  case ArrayNewElemId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayNewElem,
               currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90636;
  case ArrayNewFixedId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayNewFixed,
               currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00a90db8;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90814;
  case ArraySetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90805;
  case ArrayLenId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00a90db8;
    }
    goto LAB_00a903b2;
  case ArrayCopyId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayCopy,currp)
    ;
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00a907f6;
  case ArrayFillId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayFill,currp)
    ;
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00a90db8;
    }
LAB_00a907f6:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_00a90805;
  case ArrayInitDataId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayInitData,
               currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_00a90db8;
    }
    goto LAB_00a8fc26;
  case ArrayInitElemId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayInitElem,
               currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_00a90db8;
    }
LAB_00a8fc26:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
LAB_00a90627:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
LAB_00a90636:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00a90829;
  case RefAsId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00a90db8;
    }
    goto LAB_00a905f1;
  case StringNewId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringNew,currp)
    ;
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_00a90db8;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>).
                     super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>).
                     super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00a90925;
  case StringConstId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringConst,
               currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00a90db8;
    }
    break;
  case StringMeasureId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringMeasure,
               currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00a90db8;
    }
LAB_00a905f1:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00a90829;
  case StringEncodeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringEncode,
               currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_00a90db8;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,wasm::Visitor<wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>).
                     super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_00a90925:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringConcat,
               currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90814;
  case StringEqId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00a90db8;
    }
LAB_00a90551:
    currp_00 = pEVar1 + 2;
LAB_00a9055c:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00a90829;
  case StringWTF16GetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringWTF16Get,
               currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00a90db8;
    }
    goto LAB_00a90814;
  case StringSliceWTFId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringSliceWTF,
               currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00a90db8;
    }
LAB_00a90805:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
LAB_00a90814:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00a90829;
  case ContNewId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitContNew,currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_00a90db8;
    }
LAB_00a903b2:
    pEVar1 = pEVar1 + 1;
LAB_00a90829:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)pEVar1);
    return;
  case ContBindId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitContBind,currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case SuspendId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSuspend,currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_00a90db8;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitResume,currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[5].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 5) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeThrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitResumeThrow,
               currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[6].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 6) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StackSwitchId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStackSwitch,
               currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_00a90db8;
    }
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00a909d3;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }